

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O3

int sprng256_next(keccak_sponge *sponge,uint8_t *entropy,size_t entropylen)

{
  byte *pbVar1;
  int iVar2;
  size_t i;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  size_t sVar6;
  uint8_t *puVar7;
  
  iVar2 = -1;
  if (entropy != (uint8_t *)0x0 && sponge != (keccak_sponge *)0x0) {
    if ((long)entropylen < 0) {
      iVar2 = -2;
    }
    else {
      iVar2 = 2;
      if (sponge->flags == 0xbf0420879da9f2d9) {
        if (entropylen != 0) {
          uVar4 = sponge->position;
          sVar6 = entropylen;
          puVar7 = entropy;
          do {
            uVar5 = 0x88 - uVar4;
            if (sVar6 < uVar5) {
              uVar5 = 0;
              do {
                pbVar1 = (byte *)((long)sponge->a + uVar5 + uVar4);
                *pbVar1 = *pbVar1 ^ puVar7[uVar5];
                uVar5 = uVar5 + 1;
              } while (sVar6 != uVar5);
              sponge->position = sponge->position + sVar6;
              break;
            }
            if (uVar4 != 0x88) {
              uVar3 = 0;
              do {
                pbVar1 = (byte *)((long)sponge->a + uVar3 + uVar4);
                *pbVar1 = *pbVar1 ^ puVar7[uVar3];
                uVar3 = uVar3 + 1;
              } while (uVar5 != uVar3);
            }
            keccakf(sponge);
            sponge->position = 0;
            puVar7 = puVar7 + uVar5;
            uVar4 = 0;
            sVar6 = sVar6 - uVar5;
          } while (sVar6 != 0);
        }
        memset(entropy,0,entropylen);
        iVar2 = sprng256_forget(sponge);
        return iVar2;
      }
    }
  }
  return iVar2;
}

Assistant:

int sprng256_next(keccak_sponge* const __restrict sponge,
                  uint8_t* const entropy,
                  const size_t entropylen) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (entropy == NULL) {
    return SPONGERR_NULL;
  }
  if (entropylen > (SIZE_MAX >> 1)) {
    return SPONGERR_RSIZE;
  }
  if (sponge->flags != FLAG_SPONGEPRG) {
    return SPONGERR_NOTINIT;
  }

  _sponge_absorb(sponge, entropy, entropylen);  // Absorb the entropy,
  memset(entropy, 0, entropylen);               // zeroize the buffer,

  int err = sprng256_forget(sponge);  // And prevent baktracking.

  return err;
}